

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O0

void __thiscall
p2t::SweepContext::InitEdges
          (SweepContext *this,vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *polyline)

{
  Point *p1;
  Edge *this_00;
  const_reference ppPVar1;
  size_type local_58;
  Edge *local_38;
  size_type local_30;
  size_t j;
  size_t i;
  size_t num_points;
  vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *polyline_local;
  SweepContext *this_local;
  
  num_points = (size_t)polyline;
  polyline_local = (vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)this;
  i = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::size(polyline);
  for (j = 0; j < i; j = j + 1) {
    if (j < i - 1) {
      local_58 = j + 1;
    }
    else {
      local_58 = 0;
    }
    local_30 = local_58;
    this_00 = (Edge *)operator_new(0x10);
    ppPVar1 = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::operator[]
                        ((vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)num_points,j);
    p1 = *ppPVar1;
    ppPVar1 = std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>::operator[]
                        ((vector<p2t::Point_*,_std::allocator<p2t::Point_*>_> *)num_points,local_30)
    ;
    Edge::Edge(this_00,p1,*ppPVar1);
    local_38 = this_00;
    std::vector<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>::push_back(&this->edge_list,&local_38);
  }
  return;
}

Assistant:

void SweepContext::InitEdges(const std::vector<Point*>& polyline)
{
  size_t num_points = polyline.size();
  for (size_t i = 0; i < num_points; i++) {
    size_t j = i < num_points - 1 ? i + 1 : 0;
    edge_list.push_back(new Edge(*polyline[i], *polyline[j]));
  }
}